

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

void __thiscall picojson::value::~value(value *this)

{
  int iVar1;
  string *this_00;
  ulong uVar2;
  
  iVar1 = this->type_;
  if (iVar1 == 5) {
    this_00 = (this->field_1).string_;
    if (this_00 != (string *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)this_00);
    }
    uVar2 = 0x30;
  }
  else if (iVar1 == 4) {
    this_00 = (this->field_1).string_;
    if (this_00 != (string *)0x0) {
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00);
    }
    uVar2 = 0x18;
  }
  else {
    if (iVar1 != 3) {
      return;
    }
    this_00 = (string *)(this->field_1).array_;
    if (this_00 != (string *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)&this_00->_M_dataplus != &this_00->field_2) {
        operator_delete(*(undefined1 **)&this_00->_M_dataplus,
                        (ulong)((long)&((_Base_ptr)(this_00->field_2)._M_allocated_capacity)->
                                       _M_color + 1));
      }
    }
    uVar2 = 0x20;
  }
  operator_delete(this_00,uVar2);
  return;
}

Assistant:

inline value::~value() {
    switch (type_) {
#define DEINIT(p) case p##type: delete p; break
      DEINIT(string_);
      DEINIT(array_);
      DEINIT(object_);
#undef DEINIT
    default: break;
    }
  }